

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_busy_timeout(sqlite3 *db,int ms)

{
  sqlite3_mutex *psVar1;
  
  psVar1 = db->mutex;
  if (ms < 1) {
    if (psVar1 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar1);
    }
    db->busyTimeout = 0;
    (db->busyHandler).xFunc = (_func_int_void_ptr_int *)0x0;
    (db->busyHandler).pArg = (void *)0x0;
    (db->busyHandler).nBusy = 0;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  else {
    if (psVar1 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar1);
    }
    (db->busyHandler).xFunc = sqliteDefaultBusyCallback;
    (db->busyHandler).pArg = db;
    (db->busyHandler).nBusy = 0;
    db->busyTimeout = 0;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    db->busyTimeout = ms;
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_busy_timeout(sqlite3 *db, int ms){
  if( ms>0 ){
    sqlite3_busy_handler(db, sqliteDefaultBusyCallback, (void*)db);
    db->busyTimeout = ms;
  }else{
    sqlite3_busy_handler(db, 0, 0);
  }
  return SQLITE_OK;
}